

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_put.c
# Opt level: O0

int buffer_putalign(buffer *s,char *buf,uint len)

{
  int iVar1;
  uint n_00;
  uint local_24;
  uint n;
  uint len_local;
  char *buf_local;
  buffer *s_local;
  
  local_24 = len;
  _n = buf;
  do {
    n_00 = s->n - s->p;
    if (local_24 <= n_00) {
      byte_copy(s->x + s->p,local_24,_n);
      s->p = local_24 + s->p;
      return 0;
    }
    byte_copy(s->x + s->p,n_00,_n);
    s->p = n_00 + s->p;
    _n = _n + n_00;
    local_24 = local_24 - n_00;
    iVar1 = buffer_flush(s);
  } while (iVar1 != -1);
  return -1;
}

Assistant:

int buffer_putalign(buffer *s,const char *buf,unsigned int len)
{
  unsigned int n;
 
  while (len > (n = s->n - s->p)) {
    byte_copy(s->x + s->p,n,buf); s->p += n; buf += n; len -= n;
    if (buffer_flush(s) == -1) return -1;
  }
  /* now len <= s->n - s->p */
  byte_copy(s->x + s->p,len,buf);
  s->p += len;
  return 0;
}